

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
randomx::VmBase<randomx::AlignedAllocator<64UL>,_false>::~VmBase
          (VmBase<randomx::AlignedAllocator<64UL>,_false> *this)

{
  undefined8 *in_RDI;
  void *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__VmBase_001484b8;
  AlignedAllocator<64UL>::freeMemory(in_stack_ffffffffffffffe8,0x126cd2);
  randomx_vm::~randomx_vm((randomx_vm *)0x126cde);
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}